

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O1

string * __thiscall QPDFMatrix::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDFMatrix *this)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  bool in_CL;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  long *local_1f0;
  undefined8 local_1e8;
  long local_1e0;
  undefined8 uStack_1d8;
  long *local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  long *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 uStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  QUtil::double_to_string_abi_cxx11_
            (&local_50,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->a) < 1e-05) & (ulong)this->a),1,
             in_CL);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_160 = *puVar4;
    lStack_158 = plVar2[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar4;
    local_170 = (ulong *)*plVar2;
  }
  local_168 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_
            (&local_70,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->b) < 1e-05) & (ulong)this->b),1,
             SUB81(puVar4,0));
  uVar5 = 0xf;
  if (local_170 != &local_160) {
    uVar5 = local_160;
  }
  if (uVar5 < local_70._M_string_length + local_168) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar6 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_70._M_string_length + local_168) goto LAB_001bbb86;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_001bbb86:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_70._M_dataplus._M_p);
  }
  local_1f0 = &local_1e0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1e0 = *plVar2;
    uStack_1d8 = puVar3[3];
  }
  else {
    local_1e0 = *plVar2;
    local_1f0 = (long *)*puVar3;
  }
  local_1e8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_140 = *puVar4;
    lStack_138 = plVar2[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar4;
    local_150 = (ulong *)*plVar2;
  }
  local_148 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_
            (&local_90,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->c) < 1e-05) & (ulong)this->c),1,
             SUB81(puVar4,0));
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < local_90._M_string_length + local_148) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar6 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_90._M_string_length + local_148) goto LAB_001bbce6;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_001bbce6:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_90._M_dataplus._M_p);
  }
  local_1d0 = &local_1c0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1c0 = *plVar2;
    uStack_1b8 = puVar3[3];
  }
  else {
    local_1c0 = *plVar2;
    local_1d0 = (long *)*puVar3;
  }
  local_1c8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_200 = *puVar4;
    lStack_1f8 = plVar2[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar4;
    local_210 = (ulong *)*plVar2;
  }
  local_208 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_
            (&local_b0,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->d) < 1e-05) & (ulong)this->d),1,
             SUB81(puVar4,0));
  uVar5 = 0xf;
  if (local_210 != &local_200) {
    uVar5 = local_200;
  }
  if (uVar5 < local_b0._M_string_length + local_208) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar6 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_b0._M_string_length + local_208) goto LAB_001bbe32;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_210);
  }
  else {
LAB_001bbe32:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_b0._M_dataplus._M_p);
  }
  local_1b0 = &local_1a0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1a0 = *plVar2;
    uStack_198 = puVar3[3];
  }
  else {
    local_1a0 = *plVar2;
    local_1b0 = (long *)*puVar3;
  }
  local_1a8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_120 = *puVar4;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar4;
    local_130 = (ulong *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_
            (&local_d0,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->e) < 1e-05) & (ulong)this->e),1,
             SUB81(puVar4,0));
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < local_d0._M_string_length + local_128) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar6 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_d0._M_string_length + local_128) goto LAB_001bbf8e;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_001bbf8e:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0._M_dataplus._M_p);
  }
  local_190 = &local_180;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_180 = *plVar2;
    uStack_178 = puVar3[3];
  }
  else {
    local_180 = *plVar2;
    local_190 = (long *)*puVar3;
  }
  local_188 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_100 = *puVar4;
    lStack_f8 = plVar2[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar4;
    local_110 = (ulong *)*plVar2;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_
            (&local_f0,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->f) < 1e-05) & (ulong)this->f),1,
             SUB81(puVar4,0));
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < local_f0._M_string_length + local_108) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar6 = local_f0.field_2._M_allocated_capacity;
    }
    if (local_f0._M_string_length + local_108 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
      goto LAB_001bc127;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0._M_dataplus._M_p);
LAB_001bc127:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar6 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFMatrix::unparse() const
{
    return (
        QUtil::double_to_string(fix_rounding(a), 5) + " " +
        QUtil::double_to_string(fix_rounding(b), 5) + " " +
        QUtil::double_to_string(fix_rounding(c), 5) + " " +
        QUtil::double_to_string(fix_rounding(d), 5) + " " +
        QUtil::double_to_string(fix_rounding(e), 5) + " " +
        QUtil::double_to_string(fix_rounding(f), 5));
}